

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

char * Gia_ManFormulaEndToken(char *pForm)

{
  char *local_20;
  char *pThis;
  int Counter;
  char *pForm_local;
  
  pThis._4_4_ = 0;
  local_20 = pForm;
  while( true ) {
    if (*local_20 == '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x280,"char *Gia_ManFormulaEndToken(char *)");
    }
    if (*local_20 == '~') break;
    if (*local_20 == '(') {
      pThis._4_4_ = pThis._4_4_ + 1;
    }
    else if (*local_20 == ')') {
      pThis._4_4_ = pThis._4_4_ + -1;
    }
    if (pThis._4_4_ == 0) {
      return local_20 + 1;
    }
    local_20 = local_20 + 1;
  }
  __assert_fail("*pThis != \'~\'",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0x278,"char *Gia_ManFormulaEndToken(char *)");
}

Assistant:

char * Gia_ManFormulaEndToken( char * pForm )
{
    int Counter = 0;
    char * pThis;
    for ( pThis = pForm; *pThis; pThis++ )
    {
        assert( *pThis != '~' );
        if ( *pThis == '(' )
            Counter++;
        else if ( *pThis == ')' )
            Counter--;
        if ( Counter == 0 )
            return pThis + 1;
    }
    assert( 0 );
    return NULL;
}